

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.c
# Opt level: O2

void matras_destroy(matras *m)

{
  matras_id_t mVar1;
  matras_id_t mVar2;
  uint uVar3;
  matras_view *v;
  void *ext;
  void *ext_00;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  while (v = (m->head).prev_view, v != (matras_view *)0x0) {
    matras_destroy_read_view(m,v);
  }
  uVar4 = (m->head).block_count;
  if (uVar4 != 0) {
    mVar1 = m->mask1;
    mVar2 = m->mask2;
    uVar3 = m->extent_size;
    ext = (m->head).root;
    uVar6 = 0;
    for (uVar5 = 0; uVar5 < uVar4; uVar5 = (ulong)((int)uVar5 + mVar1 + 1)) {
      ext_00 = *(void **)((long)ext + (ulong)uVar6 * 8);
      uVar7 = 0;
      for (uVar4 = uVar5; (uVar3 >> 3 != uVar7 && (uVar4 < (m->head).block_count));
          uVar4 = (ulong)((int)uVar4 + mVar2 + 1)) {
        matras_free_extent(m,*(void **)((long)ext_00 + uVar7 * 8));
        uVar7 = uVar7 + 1;
      }
      matras_free_extent(m,ext_00);
      uVar6 = uVar6 + 1;
      uVar4 = (m->head).block_count;
    }
    matras_free_extent(m,ext);
    if (m->extent_count != 0) {
      __assert_fail("m->extent_count == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/matras.c"
                    ,0xa7,"void matras_destroy(struct matras *)");
    }
  }
  return;
}

Assistant:

void
matras_destroy(struct matras *m)
{
	while (m->head.prev_view)
		matras_destroy_read_view(m, m->head.prev_view);
	if (m->head.block_count == 0)
		return;

	matras_id_t step1 = m->mask1 + 1;
	matras_id_t step2 = m->mask2 + 1;
	matras_id_t i1 = 0, j1 = 0, i2, j2;
	matras_id_t ptrs_in_ext = m->extent_size / (matras_id_t)sizeof(void *);
	struct matras_view *v = &m->head;
	void **extent1 = (void **)v->root;
	for (; j1 < v->block_count; i1++, j1 += step1) {
		void **extent2 = (void **)extent1[i1];
		for (i2 = j2 = 0;
		     i2 < ptrs_in_ext && j1 + j2 < v->block_count;
		     i2++, j2 += step2) {
			void **extent3 = (void **)extent2[i2];
			matras_free_extent(m, extent3);
		}
		matras_free_extent(m, extent2);
	}
	matras_free_extent(m, extent1);

	assert(m->extent_count == 0);
}